

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

long ConnectionKillOne(SessionHandle *data)

{
  connectdata *pcVar1;
  conncache *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  timeval newer;
  
  newer = curlx_tvnow();
  pcVar2 = (data->state).connc;
  if (pcVar2 == (conncache *)0x0) {
    lVar6 = -1;
  }
  else {
    lVar5 = -1;
    lVar4 = 0;
    lVar6 = -1;
    do {
      if (pcVar2->num <= lVar4) break;
      pcVar1 = pcVar2->connects[lVar4];
      if (((pcVar1 != (connectdata *)0x0) && (pcVar1->inuse == false)) &&
         (lVar3 = curlx_tvdiff(newer,pcVar1->now), lVar5 < lVar3)) {
        lVar5 = lVar3;
        lVar6 = lVar4;
      }
      lVar4 = lVar4 + 1;
      pcVar2 = (data->state).connc;
    } while (pcVar2 != (conncache *)0x0);
  }
  if (-1 < lVar6) {
    pcVar1 = pcVar2->connects[lVar6];
    pcVar1->data = data;
    Curl_disconnect(pcVar1,false);
    ((data->state).connc)->connects[lVar6] = (connectdata *)0x0;
  }
  return lVar6;
}

Assistant:

static long
ConnectionKillOne(struct SessionHandle *data)
{
  long i;
  struct connectdata *conn;
  long highscore=-1;
  long connindex=-1;
  long score;
  struct timeval now;

  now = Curl_tvnow();

  for(i=0; data->state.connc && (i< data->state.connc->num); i++) {
    conn = data->state.connc->connects[i];

    if(!conn || conn->inuse)
      continue;

    /* Set higher score for the age passed since the connection was used */
    score = Curl_tvdiff(now, conn->now);

    if(score > highscore) {
      highscore = score;
      connindex = i;
    }
  }
  if(connindex >= 0) {
    /* Set the connection's owner correctly */
    conn = data->state.connc->connects[connindex];
    conn->data = data;

    /* the winner gets the honour of being disconnected */
    (void)Curl_disconnect(conn, /* dead_connection */ FALSE);

    /* clean the array entry */
    data->state.connc->connects[connindex] = NULL;
  }

  return connindex; /* return the available index or -1 */
}